

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O2

void CopyTempOutputBuffersToHostOutputBuffers(PaUtilBufferProcessor *bp)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  void *pvVar8;
  PaUtilChannelDescriptor *pPVar9;
  ulong uVar10;
  uint local_4c;
  
  puVar1 = bp->hostOutputFrameCount;
  puVar2 = bp->hostOutputFrameCount + 1;
  uVar5 = bp->framesInTempOutputBuffer;
  while( true ) {
    if (uVar5 == 0) {
      return;
    }
    uVar3 = *puVar1;
    if (uVar3 + *puVar2 == 0) break;
    uVar10 = *puVar2;
    if (uVar3 != 0) {
      uVar10 = uVar3;
    }
    if (uVar5 <= uVar10) {
      uVar10 = uVar5;
    }
    uVar6 = bp->bytesPerUserOutputSample;
    if (bp->userOutputIsInterleaved == 0) {
      lVar7 = (bp->framesPerUserBuffer - uVar5) * (ulong)uVar6;
      uVar6 = (int)bp->framesPerUserBuffer * uVar6;
      local_4c = 1;
    }
    else {
      local_4c = bp->outputChannelCount;
      lVar7 = (bp->framesPerUserBuffer - uVar5) * (ulong)(local_4c * uVar6);
    }
    pPVar9 = bp->hostOutputChannels[uVar3 == 0];
    pvVar8 = (void *)(lVar7 + (long)bp->tempOutputBuffer);
    for (uVar5 = 0; uVar5 < bp->outputChannelCount; uVar5 = uVar5 + 1) {
      if (pPVar9->data == (void *)0x0) {
        __assert_fail("hostOutputChannels[i].data != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_process.c"
                      ,0x4e9,
                      "void CopyTempOutputBuffersToHostOutputBuffers(PaUtilBufferProcessor *)");
      }
      (*bp->outputConverter)
                (pPVar9->data,pPVar9->stride,pvVar8,local_4c,(uint)uVar10,&bp->ditherGenerator);
      pPVar9->data = (void *)((long)pPVar9->data +
                             (ulong)(pPVar9->stride * (uint)uVar10 * bp->bytesPerHostOutputSample));
      pvVar8 = (void *)((long)pvVar8 + (ulong)uVar6);
      pPVar9 = pPVar9 + 1;
    }
    uVar3 = *puVar1;
    puVar4 = puVar1;
    if (uVar3 == 0) {
      uVar3 = *puVar2;
      puVar4 = puVar2;
    }
    *puVar4 = uVar3 - (uVar10 & 0xffffffff);
    uVar5 = bp->framesInTempOutputBuffer - (uVar10 & 0xffffffff);
    bp->framesInTempOutputBuffer = uVar5;
  }
  return;
}

Assistant:

static void CopyTempOutputBuffersToHostOutputBuffers( PaUtilBufferProcessor *bp)
{
    unsigned long maxFramesToCopy;
    PaUtilChannelDescriptor *hostOutputChannels;
    unsigned int frameCount;
    unsigned char *srcBytePtr;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;

    /* copy frames from user to host output buffers */
    while( bp->framesInTempOutputBuffer > 0 &&
            ((bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1]) > 0) )
    {
        maxFramesToCopy = bp->framesInTempOutputBuffer;

        /* select the output buffer set (1st or 2nd) */
        if( bp->hostOutputFrameCount[0] > 0 )
        {
            hostOutputChannels = bp->hostOutputChannels[0];
            frameCount = PA_MIN_( bp->hostOutputFrameCount[0], maxFramesToCopy );
        }
        else
        {
            hostOutputChannels = bp->hostOutputChannels[1];
            frameCount = PA_MIN_( bp->hostOutputFrameCount[1], maxFramesToCopy );
        }

        if( bp->userOutputIsInterleaved )
        {
            srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                    bp->bytesPerUserOutputSample * bp->outputChannelCount *
                    (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);

            srcSampleStrideSamples = bp->outputChannelCount;
            srcChannelStrideBytes = bp->bytesPerUserOutputSample;
        }
        else /* user output is not interleaved */
        {
            srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                    bp->bytesPerUserOutputSample *
                    (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);

            srcSampleStrideSamples = 1;
            srcChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
        }

        for( i=0; i<bp->outputChannelCount; ++i )
        {
            assert( hostOutputChannels[i].data != NULL );
            bp->outputConverter(    hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    srcBytePtr, srcSampleStrideSamples,
                                    frameCount, &bp->ditherGenerator );

            srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

            /* advance dest ptr for next iteration */
            hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                    frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
        }

        if( bp->hostOutputFrameCount[0] > 0 )
            bp->hostOutputFrameCount[0] -= frameCount;
        else
            bp->hostOutputFrameCount[1] -= frameCount;

        bp->framesInTempOutputBuffer -= frameCount;
    }
}